

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGeneratorTarget.cxx
# Opt level: O3

void __thiscall
cmGeneratorTarget::ComputeLinkInterface
          (cmGeneratorTarget *this,string *config,cmOptionalLinkInterface *iface,
          cmGeneratorTarget *headTarget,bool secondPass)

{
  pointer pcVar1;
  pointer pcVar2;
  cmGeneratorTarget *pcVar3;
  TargetType TVar4;
  PolicyStatus PVar5;
  cmLinkImplementation *pcVar6;
  cmLinkImplementationLibraries *pcVar7;
  cmValue cVar8;
  vector<cmLinkItem,_std::allocator<cmLinkItem>_> *__range3;
  cmLinkItem *lib;
  pointer __v;
  pointer __v_00;
  initializer_list<std::basic_string_view<char,_std::char_traits<char>_>_> views;
  pair<std::_Rb_tree_iterator<cmLinkItem>,_bool> pVar9;
  set<cmLinkItem,_std::less<cmLinkItem>,_std::allocator<cmLinkItem>_> emitted;
  string suffix;
  size_type __dnew;
  string propName;
  undefined1 local_a8 [8];
  undefined1 local_a0 [24];
  _Base_ptr local_88;
  size_t local_80;
  _Base_ptr local_78;
  _Base_ptr local_70;
  undefined1 local_68 [40];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_40;
  
  if ((iface->super_cmLinkInterface).field_0xf5 == '\x01') {
    TVar4 = cmTarget::GetType(this->Target);
    if (((TVar4 == SHARED_LIBRARY) ||
        (TVar4 = cmTarget::GetType(this->Target), TVar4 == STATIC_LIBRARY)) ||
       (TVar4 = cmTarget::GetType(this->Target), TVar4 == INTERFACE_LIBRARY)) {
      local_a0._16_8_ = local_a0;
      local_a0._0_8_ = local_a0._0_8_ & 0xffffffff00000000;
      local_a0._8_8_ = (_Base_ptr)0x0;
      local_80 = 0;
      __v = (iface->super_cmLinkInterface).super_cmLinkInterfaceLibraries.Libraries.
            super__Vector_base<cmLinkItem,_std::allocator<cmLinkItem>_>._M_impl.
            super__Vector_impl_data._M_start;
      pcVar1 = (iface->super_cmLinkInterface).super_cmLinkInterfaceLibraries.Libraries.
               super__Vector_base<cmLinkItem,_std::allocator<cmLinkItem>_>._M_impl.
               super__Vector_impl_data._M_finish;
      local_88 = (_Base_ptr)local_a0._16_8_;
      if (__v != pcVar1) {
        do {
          std::
          _Rb_tree<cmLinkItem,cmLinkItem,std::_Identity<cmLinkItem>,std::less<cmLinkItem>,std::allocator<cmLinkItem>>
          ::_M_insert_unique<cmLinkItem_const&>
                    ((_Rb_tree<cmLinkItem,cmLinkItem,std::_Identity<cmLinkItem>,std::less<cmLinkItem>,std::allocator<cmLinkItem>>
                      *)local_a8,__v);
          __v = __v + 1;
        } while (__v != pcVar1);
      }
      TVar4 = cmTarget::GetType(this->Target);
      if (TVar4 != INTERFACE_LIBRARY) {
        pcVar6 = GetLinkImplementation(this,config,Link,secondPass);
        __v_00 = (pcVar6->super_cmLinkImplementationLibraries).Libraries.
                 super__Vector_base<cmLinkImplItem,_std::allocator<cmLinkImplItem>_>._M_impl.
                 super__Vector_impl_data._M_start;
        pcVar2 = (pcVar6->super_cmLinkImplementationLibraries).Libraries.
                 super__Vector_base<cmLinkImplItem,_std::allocator<cmLinkImplItem>_>._M_impl.
                 super__Vector_impl_data._M_finish;
        if (__v_00 != pcVar2) {
          do {
            pVar9 = std::
                    _Rb_tree<cmLinkItem,cmLinkItem,std::_Identity<cmLinkItem>,std::less<cmLinkItem>,std::allocator<cmLinkItem>>
                    ::_M_insert_unique<cmLinkItem_const&>
                              ((_Rb_tree<cmLinkItem,cmLinkItem,std::_Identity<cmLinkItem>,std::less<cmLinkItem>,std::allocator<cmLinkItem>>
                                *)local_a8,&__v_00->super_cmLinkItem);
            if (((((undefined1  [16])pVar9 & (undefined1  [16])0x1) != (undefined1  [16])0x0) &&
                (pcVar3 = (__v_00->super_cmLinkItem).Target, pcVar3 != (cmGeneratorTarget *)0x0)) &&
               (TVar4 = cmTarget::GetType(pcVar3->Target), TVar4 == SHARED_LIBRARY)) {
              std::vector<cmLinkItem,_std::allocator<cmLinkItem>_>::push_back
                        (&(iface->super_cmLinkInterface).SharedDeps,&__v_00->super_cmLinkItem);
            }
            __v_00 = __v_00 + 1;
          } while (__v_00 != pcVar2);
        }
      }
      std::
      _Rb_tree<cmLinkItem,_cmLinkItem,_std::_Identity<cmLinkItem>,_std::less<cmLinkItem>,_std::allocator<cmLinkItem>_>
      ::~_Rb_tree((_Rb_tree<cmLinkItem,_cmLinkItem,_std::_Identity<cmLinkItem>,_std::less<cmLinkItem>,_std::allocator<cmLinkItem>_>
                   *)local_a8);
    }
  }
  else {
    PVar5 = cmPolicies::PolicyMap::Get(&this->PolicyMap,CMP0022);
    if ((PVar5 == WARN) ||
       (PVar5 = cmPolicies::PolicyMap::Get(&this->PolicyMap,CMP0022), PVar5 == OLD)) {
      pcVar7 = GetLinkImplementationLibrariesInternal(this,config,headTarget,Link);
      (iface->super_cmLinkInterface).ImplementationIsInterface = true;
      std::vector<cmLinkItem,_std::allocator<cmLinkItem>_>::operator=
                (&(iface->super_cmLinkInterface).WrongConfigLibraries,&pcVar7->WrongConfigLibraries)
      ;
    }
  }
  TVar4 = cmTarget::GetType(this->Target);
  if ((TVar4 == STATIC_LIBRARY) &&
     (pcVar6 = GetLinkImplementation(this,config,Link,secondPass),
     pcVar6 != (cmLinkImplementation *)0x0)) {
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::operator=(&(iface->super_cmLinkInterface).Languages,&pcVar6->Languages);
  }
  TVar4 = cmTarget::GetType(this->Target);
  if (TVar4 != STATIC_LIBRARY) {
    return;
  }
  local_68._0_2_ = 0x5f;
  local_70 = (_Base_ptr)0x1;
  local_78 = (_Base_ptr)local_68;
  if (config->_M_string_length == 0) {
    std::__cxx11::string::append((char *)&local_78);
  }
  else {
    cmsys::SystemTools::UpperCase((string *)local_a8,config);
    std::__cxx11::string::_M_append((char *)&local_78,(ulong)local_a8);
    if (local_a8 != (undefined1  [8])(local_a0 + 8)) {
      operator_delete((void *)local_a8,(ulong)(local_a0._8_8_ + 1));
    }
  }
  local_a8 = (undefined1  [8])0x1b;
  local_a0._0_8_ = "LINK_INTERFACE_MULTIPLICITY";
  local_a0._8_8_ = local_70;
  local_a0._16_8_ = local_78;
  views._M_len = 2;
  views._M_array = (iterator)local_a8;
  cmCatViews_abi_cxx11_((string *)(local_68 + 0x18),views);
  cVar8 = GetProperty(this,(string *)(local_68 + 0x18));
  if (cVar8.Value == (string *)0x0) {
    local_68._16_8_ = (_Base_ptr)0x1b;
    local_a8 = (undefined1  [8])(local_a0 + 8);
    local_a8 = (undefined1  [8])
               std::__cxx11::string::_M_create((ulong *)local_a8,(ulong)(local_68 + 0x10));
    local_a0._8_8_ = local_68._16_8_;
    builtin_strncpy((char *)local_a8,"LINK_INTERFACE_MULTIPLICITY",0x1b);
    local_a0._0_8_ = local_68._16_8_;
    *(char *)((long)local_a8 + local_68._16_8_) = '\0';
    cVar8 = GetProperty(this,(string *)local_a8);
    if (local_a8 != (undefined1  [8])(local_a0 + 8)) {
      operator_delete((void *)local_a8,(ulong)(local_a0._8_8_ + 1));
    }
    if (cVar8.Value == (string *)0x0) goto LAB_003e60ce;
  }
  __isoc99_sscanf(((cVar8.Value)->_M_dataplus)._M_p,"%u",
                  &(iface->super_cmLinkInterface).Multiplicity);
LAB_003e60ce:
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_68._24_8_ != &local_40) {
    operator_delete((void *)local_68._24_8_,local_40._M_allocated_capacity + 1);
  }
  if (local_78 != (_Base_ptr)local_68) {
    operator_delete(local_78,CONCAT62(local_68._2_6_,local_68._0_2_) + 1);
  }
  return;
}

Assistant:

void cmGeneratorTarget::ComputeLinkInterface(
  const std::string& config, cmOptionalLinkInterface& iface,
  cmGeneratorTarget const* headTarget, bool secondPass) const
{
  if (iface.Explicit) {
    if (this->GetType() == cmStateEnums::SHARED_LIBRARY ||
        this->GetType() == cmStateEnums::STATIC_LIBRARY ||
        this->GetType() == cmStateEnums::INTERFACE_LIBRARY) {
      // Shared libraries may have runtime implementation dependencies
      // on other shared libraries that are not in the interface.
      std::set<cmLinkItem> emitted;
      for (cmLinkItem const& lib : iface.Libraries) {
        emitted.insert(lib);
      }
      if (this->GetType() != cmStateEnums::INTERFACE_LIBRARY) {
        cmLinkImplementation const* impl = this->GetLinkImplementation(
          config, LinkInterfaceFor::Link, secondPass);
        for (cmLinkImplItem const& lib : impl->Libraries) {
          if (emitted.insert(lib).second) {
            if (lib.Target) {
              // This is a runtime dependency on another shared library.
              if (lib.Target->GetType() == cmStateEnums::SHARED_LIBRARY) {
                iface.SharedDeps.push_back(lib);
              }
            } else {
              // TODO: Recognize shared library file names.  Perhaps this
              // should be moved to cmComputeLinkInformation, but that
              // creates a chicken-and-egg problem since this list is needed
              // for its construction.
            }
          }
        }
      }
    }
  } else if (this->GetPolicyStatusCMP0022() == cmPolicies::WARN ||
             this->GetPolicyStatusCMP0022() == cmPolicies::OLD) {
    // The link implementation is the default link interface.
    cmLinkImplementationLibraries const* impl =
      this->GetLinkImplementationLibrariesInternal(config, headTarget,
                                                   LinkInterfaceFor::Link);
    iface.ImplementationIsInterface = true;
    iface.WrongConfigLibraries = impl->WrongConfigLibraries;
  }

  if (this->LinkLanguagePropagatesToDependents()) {
    // Targets using this archive need its language runtime libraries.
    if (cmLinkImplementation const* impl = this->GetLinkImplementation(
          config, LinkInterfaceFor::Link, secondPass)) {
      iface.Languages = impl->Languages;
    }
  }

  if (this->GetType() == cmStateEnums::STATIC_LIBRARY) {
    // Construct the property name suffix for this configuration.
    std::string suffix = "_";
    if (!config.empty()) {
      suffix += cmSystemTools::UpperCase(config);
    } else {
      suffix += "NOCONFIG";
    }

    // How many repetitions are needed if this library has cyclic
    // dependencies?
    std::string propName = cmStrCat("LINK_INTERFACE_MULTIPLICITY", suffix);
    if (cmValue config_reps = this->GetProperty(propName)) {
      sscanf(config_reps->c_str(), "%u", &iface.Multiplicity);
    } else if (cmValue reps =
                 this->GetProperty("LINK_INTERFACE_MULTIPLICITY")) {
      sscanf(reps->c_str(), "%u", &iface.Multiplicity);
    }
  }
}